

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

bool str2num(SQChar *s,SQObjectPtr *res,SQInteger base)

{
  char cVar1;
  bool bVar2;
  SQObjectPtr *this;
  long in_RDX;
  char *in_RDI;
  SQInteger r_1;
  SQFloat r;
  SQChar c;
  bool isfloat;
  bool iseintbase;
  SQChar *e;
  SQChar *end;
  undefined4 in_stack_ffffffffffffffb8;
  SQFloat in_stack_ffffffffffffffbc;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  char *local_30;
  char *local_28 [3];
  char *local_10;
  
  bVar2 = false;
  local_30 = in_RDI;
  do {
    cVar1 = *local_30;
    if (cVar1 == '\0') {
LAB_0013f790:
      local_10 = in_RDI;
      if (bVar2) {
        strtod(in_RDI,local_28);
        if (local_10 == local_28[0]) {
          return false;
        }
        SQObjectPtr::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      else {
        this = (SQObjectPtr *)strtoll(in_RDI,local_28,(int)in_RDX);
        if (local_10 == local_28[0]) {
          return false;
        }
        SQObjectPtr::operator=(this,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      return true;
    }
    if ((cVar1 == '.') || ((in_RDX < 0xe && ((cVar1 == 'E' || (cVar1 == 'e')))))) {
      bVar2 = true;
      goto LAB_0013f790;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static bool str2num(const SQChar *s,SQObjectPtr &res,SQInteger base)
{
    SQChar *end;
    const SQChar *e = s;
    bool iseintbase = base > 13; //to fix error converting hexadecimals with e like 56f0791e
    bool isfloat = false;
    SQChar c;
    while((c = *e) != _SC('\0'))
    {
        if (c == _SC('.') || (!iseintbase && (c == _SC('E') || c == _SC('e')))) { //e and E is for scientific notation
            isfloat = true;
            break;
        }
        e++;
    }
    if(isfloat){
        SQFloat r = SQFloat(scstrtod(s,&end));
        if(s == end) return false;
        res = r;
    }
    else{
        SQInteger r = SQInteger(scstrtol(s,&end,(int)base));
        if(s == end) return false;
        res = r;
    }
    return true;
}